

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamWriterPrivate::EncodeQuerySequence
          (BamWriterPrivate *this,string *query,string *encodedQuery)

{
  bool bVar1;
  BamException *this_00;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  byte *pbVar5;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string message;
  
  std::__cxx11::string::resize((ulong)encodedQuery);
  pcVar3 = (query->_M_dataplus)._M_p;
  bVar1 = true;
  pbVar2 = (byte *)(encodedQuery->_M_dataplus)._M_p;
  do {
    switch(*pcVar3) {
    case '=':
      bVar4 = 0;
      break;
    case 'A':
      bVar4 = 1;
      break;
    case 'B':
      bVar4 = 0xe;
      break;
    case 'C':
      bVar4 = 2;
      break;
    case 'D':
      bVar4 = 0xd;
      break;
    case 'G':
      bVar4 = 4;
      break;
    case 'H':
      bVar4 = 0xb;
      break;
    case 'K':
      bVar4 = 0xc;
      break;
    case 'M':
      bVar4 = 3;
      break;
    case 'N':
      bVar4 = 0xf;
      break;
    case 'R':
      bVar4 = 5;
      break;
    case 'S':
      bVar4 = 6;
      break;
    case 'T':
      bVar4 = 8;
      break;
    case 'V':
      bVar4 = 7;
      break;
    case 'W':
      bVar4 = 9;
      break;
    case 'Y':
      bVar4 = 10;
      break;
    default:
      if (*pcVar3 == '\0') {
        return;
      }
    case '>':
    case '?':
    case '@':
    case 'E':
    case 'F':
    case 'I':
    case 'J':
    case 'L':
    case 'O':
    case 'P':
    case 'Q':
    case 'U':
    case 'X':
      std::__cxx11::string::string((string *)&local_58,"invalid base: ",&local_59);
      std::operator+(&message,&local_58,*pcVar3);
      std::__cxx11::string::~string((string *)&local_58);
      this_00 = (BamException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_58,"BamWriter::EncodeQuerySequence",&local_59);
      BamException::BamException(this_00,&local_58,&message);
      __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
    }
    if (bVar1) {
      bVar4 = bVar4 << 4;
      pbVar5 = pbVar2;
    }
    else {
      bVar4 = bVar4 | *pbVar2;
      pbVar5 = pbVar2 + 1;
    }
    *pbVar2 = bVar4;
    bVar1 = (bool)(bVar1 ^ 1);
    pcVar3 = pcVar3 + 1;
    pbVar2 = pbVar5;
  } while( true );
}

Assistant:

void BamWriterPrivate::EncodeQuerySequence(const std::string& query, std::string& encodedQuery)
{

    // prepare the encoded query string
    const std::size_t queryLength = query.size();
    const std::size_t encodedQueryLength = static_cast<std::size_t>((queryLength + 1) / 2);
    encodedQuery.resize(encodedQueryLength);
    char* pEncodedQuery = (char*)encodedQuery.data();
    const char* pQuery = (const char*)query.data();

    // walk through original query sequence, encoding its bases
    unsigned char nucleotideCode;
    bool useHighWord = true;
    while (*pQuery) {
        switch (*pQuery) {
            case (Constants::BAM_DNA_EQUAL):
                nucleotideCode = Constants::BAM_BASECODE_EQUAL;
                break;
            case (Constants::BAM_DNA_A):
                nucleotideCode = Constants::BAM_BASECODE_A;
                break;
            case (Constants::BAM_DNA_C):
                nucleotideCode = Constants::BAM_BASECODE_C;
                break;
            case (Constants::BAM_DNA_M):
                nucleotideCode = Constants::BAM_BASECODE_M;
                break;
            case (Constants::BAM_DNA_G):
                nucleotideCode = Constants::BAM_BASECODE_G;
                break;
            case (Constants::BAM_DNA_R):
                nucleotideCode = Constants::BAM_BASECODE_R;
                break;
            case (Constants::BAM_DNA_S):
                nucleotideCode = Constants::BAM_BASECODE_S;
                break;
            case (Constants::BAM_DNA_V):
                nucleotideCode = Constants::BAM_BASECODE_V;
                break;
            case (Constants::BAM_DNA_T):
                nucleotideCode = Constants::BAM_BASECODE_T;
                break;
            case (Constants::BAM_DNA_W):
                nucleotideCode = Constants::BAM_BASECODE_W;
                break;
            case (Constants::BAM_DNA_Y):
                nucleotideCode = Constants::BAM_BASECODE_Y;
                break;
            case (Constants::BAM_DNA_H):
                nucleotideCode = Constants::BAM_BASECODE_H;
                break;
            case (Constants::BAM_DNA_K):
                nucleotideCode = Constants::BAM_BASECODE_K;
                break;
            case (Constants::BAM_DNA_D):
                nucleotideCode = Constants::BAM_BASECODE_D;
                break;
            case (Constants::BAM_DNA_B):
                nucleotideCode = Constants::BAM_BASECODE_B;
                break;
            case (Constants::BAM_DNA_N):
                nucleotideCode = Constants::BAM_BASECODE_N;
                break;
            default:
                const std::string message = std::string("invalid base: ") + *pQuery;
                throw BamException("BamWriter::EncodeQuerySequence", message);
        }

        // pack the nucleotide code
        if (useHighWord) {
            *pEncodedQuery = nucleotideCode << 4;
            useHighWord = false;
        } else {
            *pEncodedQuery |= nucleotideCode;
            ++pEncodedQuery;
            useHighWord = true;
        }

        // increment the query position
        ++pQuery;
    }
}